

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomString::~DomString(DomString *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_id).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_extraComment).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_comment).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_notr).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomString::~DomString() = default;